

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O1

void dfsTraversal_CLG(ClgGraph clgGraph)

{
  uint uVar1;
  long lVar2;
  _Bool *p_Var3;
  _Bool *p_Var4;
  _Bool *visited;
  long lVar5;
  code *pcStack_30;
  _Bool a_Stack_28 [8];
  
  if (clgGraph != (ClgGraph)0x0) {
    uVar1 = clgGraph->vertexSize;
    lVar2 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
    visited = a_Stack_28 + lVar2;
    if (0 < (int)uVar1) {
      p_Var3 = a_Stack_28 + lVar2 + -8;
      p_Var3[0] = true;
      p_Var3[1] = true;
      p_Var3[2] = true;
      p_Var3[3] = false;
      p_Var3[4] = false;
      p_Var3[5] = false;
      p_Var3[6] = false;
      p_Var3[7] = false;
      memset(visited,0,(ulong)uVar1);
    }
    if (0 < clgGraph->vertexSize) {
      lVar5 = 0;
      do {
        if (visited[lVar5] == false) {
          p_Var4 = a_Stack_28 + lVar2 + -8;
          p_Var4[0] = true;
          p_Var4[1] = true;
          p_Var4[2] = true;
          p_Var4[3] = false;
          p_Var4[4] = false;
          p_Var4[5] = false;
          p_Var4[6] = false;
          p_Var4[7] = false;
          dfs_CLG(clgGraph,visited,(int)lVar5);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < clgGraph->vertexSize);
    }
    fwrite(anon_var_dwarf_6286 + 0x42,2,1,_stdout);
    return;
  }
  pcStack_30 = dfs_CLG;
  __assert_fail("clgGraph",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/cross_list_graph.c"
                ,0x126,"void dfsTraversal_CLG(ClgGraph)");
}

Assistant:

void dfsTraversal_CLG(ClgGraph clgGraph) {
    assert(clgGraph);
    bool visited[clgGraph->vertexSize];

    for (int i = 0; i < clgGraph->vertexSize; ++i)
        visited[i] = false;

    for (int i = 0; i < clgGraph->vertexSize; ++i) {
        if (visited[i]) continue;
        dfs_CLG(clgGraph, visited, i);
    }
    fprintf(stdout, "\n\n");
}